

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

void __thiscall
cxxopts::OptionValue::parse_default
          (OptionValue *this,shared_ptr<const_cxxopts::OptionDetails> *details)

{
  ensure_value(this,details);
  this->m_default = true;
  this->m_long_names =
       &((details->super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>).
        _M_ptr)->m_long;
  (*((this->m_value).super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_Value[4])();
  return;
}

Assistant:

void
  parse_default(const std::shared_ptr<const OptionDetails>& details)
  {
    ensure_value(details);
    m_default = true;
    m_long_names = &details->long_names();
    m_value->parse();
  }